

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void dofiretrap(obj *box)

{
  byte give_feedback;
  byte bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *local_30;
  char *local_20;
  bool local_13;
  byte local_12;
  boolean see_it;
  obj *box_local;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (local_12 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    local_13 = false;
    if (ublindf != (obj *)0x0) {
      local_13 = ublindf->oartifact == '\x1d';
    }
    local_12 = local_13 ^ 0xff;
  }
  give_feedback = (local_12 ^ 0xff) & 1;
  if ((box == (obj *)0x0) || (box->where == '\x03')) {
    bVar1 = (byte)u._1052_1_ >> 1 & 1;
  }
  else {
    bVar1 = is_pool(level,(int)box->ox,(int)box->oy);
  }
  if (bVar1 == 0) {
    pcVar4 = "erupts";
    if (box == (obj *)0x0) {
      local_30 = surface((int)u.ux,(int)u.uy);
    }
    else {
      pcVar4 = "bursts";
      local_30 = xname(box);
    }
    the(local_30);
    pline("A %s %s from %s!","tower of flame",pcVar4);
    iVar3 = dice(2,4);
    fire_damageu(iVar3,(monst *)0x0,"tower of flame",0,0x14,'\x01','\x01');
    if (((box == (obj *)0x0) &&
        (iVar3 = burn_floor_paper((int)u.ux,(int)u.uy,give_feedback,'\x01'), iVar3 != 0)) &&
       (give_feedback == 0)) {
      pline("You smell paper burning.");
    }
    bVar2 = is_ice(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      melt_ice(u.ux,u.uy);
    }
  }
  else {
    if (box == (obj *)0x0) {
      local_20 = surface((int)u.ux,(int)u.uy);
    }
    else {
      local_20 = xname(box);
    }
    pcVar4 = the(local_20);
    pline("A cascade of steamy bubbles erupts from %s!",pcVar4);
    if (((u.uprops[1].intrinsic == 0) && (u.uprops[1].extrinsic == 0)) &&
       ((youmonst.mintrinsics & 1) == 0)) {
      iVar3 = rnd(3);
      losehp(iVar3,"boiling water",1);
    }
  }
  return;
}

Assistant:

static void dofiretrap(struct obj *box)
{
	boolean see_it = !Blind;

/* Bug: for box case, the equivalent of burn_floor_paper() ought
 * to be done upon its contents.
 */

	if ((box && !carried(box)) ? is_pool(level, box->ox, box->oy) : Underwater) {
	    pline("A cascade of steamy bubbles erupts from %s!",
		    the(box ? xname(box) : surface(u.ux,u.uy)));
	    if (!Fire_resistance)
		losehp(rnd(3), "boiling water", KILLED_BY);
	    return;
	}
	pline("A %s %s from %s!", tower_of_flame,
	      box ? "bursts" : "erupts",
	      the(box ? xname(box) : surface(u.ux,u.uy)));
	fire_damageu(dice(2, 4), NULL, tower_of_flame, KILLED_BY_AN, 20, TRUE, TRUE);
	if (!box && burn_floor_paper(u.ux, u.uy, see_it, TRUE) && !see_it)
	    pline("You smell paper burning.");
	if (is_ice(level, u.ux, u.uy))
	    melt_ice(u.ux, u.uy);
}